

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtzone.cpp
# Opt level: O0

void __thiscall
icu_63::VTimeZone::writeZone
          (VTimeZone *this,VTZWriter *w,BasicTimeZone *basictz,UVector *customProps,
          UErrorCode *status)

{
  int32_t month_00;
  UBool UVar1;
  int8_t iVar2;
  char cVar3;
  uint uVar4;
  int iVar5;
  int32_t iVar6;
  int32_t iVar7;
  void *pvVar8;
  TimeZoneRule *pTVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  DateTimeRule *pDVar10;
  size_t __n;
  void *__buf;
  void *__buf_00;
  UDate UVar11;
  AnnualTimeZoneRule *local_348;
  AnnualTimeZoneRule *local_318;
  UDate UStack_270;
  UBool nextStartAvail_1;
  UDate nextStart_1;
  UDate UStack_260;
  UBool nextStartAvail;
  UDate nextStart;
  undefined1 local_250 [8];
  UnicodeString tzid;
  int local_208;
  int32_t offset;
  int32_t dst;
  int32_t raw;
  AnnualTimeZoneRule *atzrule;
  int iStack_1f0;
  UBool sameRule;
  int32_t weekInMonth;
  int32_t toOffset;
  int32_t fromDSTSavings;
  int32_t fromOffset;
  UBool isDst;
  UnicodeString name;
  undefined1 local_198 [7];
  UBool tztAvail;
  TimeZoneTransition tzt;
  int local_170;
  UBool hasTransitions;
  int32_t mid;
  int32_t doy;
  int32_t dow;
  int32_t dom;
  int32_t month;
  int32_t year;
  AnnualTimeZoneRule *finalStdRule;
  UDate UStack_148;
  int32_t stdCount;
  UDate stdUntilTime;
  UDate stdStartTime;
  int32_t local_130;
  int32_t stdMillisInDay;
  int32_t stdWeekInMonth;
  int32_t stdDayOfWeek;
  int32_t stdMonth;
  int32_t stdStartYear;
  int32_t stdToOffset;
  int32_t stdFromDSTSavings;
  int32_t stdFromOffset;
  undefined1 local_108 [8];
  UnicodeString stdName;
  AnnualTimeZoneRule *finalDstRule;
  UDate UStack_b8;
  int32_t dstCount;
  UDate dstUntilTime;
  UDate dstStartTime;
  int32_t dstMillisInDay;
  int32_t dstWeekInMonth;
  int32_t dstDayOfWeek;
  int32_t dstMonth;
  int32_t dstStartYear;
  int32_t dstToOffset;
  int32_t dstFromDSTSavings;
  int32_t dstFromOffset;
  UnicodeString dstName;
  UDate t;
  UnicodeString *custprop;
  int32_t i;
  UErrorCode *status_local;
  UVector *customProps_local;
  BasicTimeZone *basictz_local;
  VTZWriter *w_local;
  VTimeZone *this_local;
  
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 != '\0') {
    return;
  }
  writeHeaders(this,w,status);
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 != '\0') {
    return;
  }
  if (customProps != (UVector *)0x0) {
    custprop._4_4_ = 0;
    while( true ) {
      uVar4 = UVector::size(customProps);
      __n = (size_t)uVar4;
      if ((int)uVar4 <= custprop._4_4_) break;
      pvVar8 = UVector::elementAt(customProps,custprop._4_4_);
      VTZWriter::write(w,(int)pvVar8,__buf,__n);
      VTZWriter::write(w,0x3eb90e,__buf_00,__n);
      custprop._4_4_ = custprop._4_4_ + 1;
    }
  }
  dstName.fUnion._48_8_ = 0xc384763b62073280;
  UnicodeString::UnicodeString((UnicodeString *)&dstFromDSTSavings);
  dstToOffset = 0;
  dstStartYear = 0;
  dstMonth = 0;
  dstDayOfWeek = 0;
  dstWeekInMonth = 0;
  dstMillisInDay = 0;
  dstStartTime._4_4_ = 0;
  dstStartTime._0_4_ = 0;
  dstUntilTime = 0.0;
  UStack_b8 = 0.0;
  finalDstRule._4_4_ = 0;
  stdName.fUnion._48_8_ = 0;
  UnicodeString::UnicodeString((UnicodeString *)local_108);
  stdToOffset = 0;
  stdStartYear = 0;
  stdMonth = 0;
  stdDayOfWeek = 0;
  stdWeekInMonth = 0;
  stdMillisInDay = 0;
  local_130 = 0;
  stdStartTime._4_4_ = 0;
  stdUntilTime = 0.0;
  UStack_148 = 0.0;
  finalStdRule._4_4_ = 0;
  _month = (AnnualTimeZoneRule *)0x0;
  tzt.fTo._7_1_ = '\0';
  TimeZoneTransition::TimeZoneTransition((TimeZoneTransition *)local_198);
  UnicodeString::UnicodeString((UnicodeString *)&fromOffset);
  do {
    while( true ) {
      iVar5 = (*(basictz->super_TimeZone).super_UObject._vptr_UObject[0xe])
                        (dstName.fUnion._48_8_,basictz,0,local_198);
      name.fUnion.fStackFields.fBuffer[0x1a]._1_1_ = (undefined1)iVar5;
      if (name.fUnion.fStackFields.fBuffer[0x1a]._1_1_ == '\0') goto LAB_002546b5;
      tzt.fTo._7_1_ = '\x01';
      dstName.fUnion._48_8_ = TimeZoneTransition::getTime((TimeZoneTransition *)local_198);
      pTVar9 = TimeZoneTransition::getTo((TimeZoneTransition *)local_198);
      TimeZoneRule::getName(pTVar9,(UnicodeString *)&fromOffset);
      pTVar9 = TimeZoneTransition::getTo((TimeZoneTransition *)local_198);
      iVar6 = TimeZoneRule::getDSTSavings(pTVar9);
      fromDSTSavings._3_1_ = iVar6 != 0;
      pTVar9 = TimeZoneTransition::getFrom((TimeZoneTransition *)local_198);
      iVar6 = TimeZoneRule::getRawOffset(pTVar9);
      pTVar9 = TimeZoneTransition::getFrom((TimeZoneTransition *)local_198);
      iVar7 = TimeZoneRule::getDSTSavings(pTVar9);
      toOffset = iVar6 + iVar7;
      pTVar9 = TimeZoneTransition::getFrom((TimeZoneTransition *)local_198);
      weekInMonth = TimeZoneRule::getDSTSavings(pTVar9);
      pTVar9 = TimeZoneTransition::getTo((TimeZoneTransition *)local_198);
      iVar6 = TimeZoneRule::getRawOffset(pTVar9);
      pTVar9 = TimeZoneTransition::getTo((TimeZoneTransition *)local_198);
      iVar7 = TimeZoneRule::getDSTSavings(pTVar9);
      iStack_1f0 = iVar6 + iVar7;
      UVar11 = TimeZoneTransition::getTime((TimeZoneTransition *)local_198);
      Grego::timeToFields(UVar11 + (double)toOffset,&dom,&dow,&doy,&mid,
                          (int32_t *)&stack0xfffffffffffffe94,&local_170);
      atzrule._4_4_ = Grego::dayOfWeekInMonth(dom,dow,doy);
      atzrule._3_1_ = '\0';
      if (fromDSTSavings._3_1_ == '\0') break;
      if (stdName.fUnion._48_8_ == 0) {
        pTVar9 = TimeZoneTransition::getTo((TimeZoneTransition *)local_198);
        if (pTVar9 == (TimeZoneRule *)0x0) {
          local_318 = (AnnualTimeZoneRule *)0x0;
        }
        else {
          local_318 = (AnnualTimeZoneRule *)
                      __dynamic_cast(pTVar9,&TimeZoneRule::typeinfo,&AnnualTimeZoneRule::typeinfo,0)
          ;
        }
        _dst = local_318;
        if ((local_318 != (AnnualTimeZoneRule *)0x0) &&
           (iVar6 = AnnualTimeZoneRule::getEndYear(local_318), iVar6 == 0x7fffffff)) {
          pTVar9 = TimeZoneTransition::getTo((TimeZoneTransition *)local_198);
          iVar5 = (*(pTVar9->super_UObject)._vptr_UObject[3])();
          stdName.fUnion._48_8_ = CONCAT44(extraout_var,iVar5);
        }
      }
      if (0 < finalDstRule._4_4_) {
        if ((((dom == dstDayOfWeek + finalDstRule._4_4_) &&
             (iVar2 = UnicodeString::compare
                                ((UnicodeString *)&fromOffset,(UnicodeString *)&dstFromDSTSavings),
             iVar2 == '\0')) && (dstToOffset == toOffset)) &&
           (((dstMonth == iStack_1f0 && (dstWeekInMonth == dow)) &&
            ((dstMillisInDay == mid &&
             ((dstStartTime._4_4_ == atzrule._4_4_ && (dstStartTime._0_4_ == local_170)))))))) {
          UStack_b8 = (UDate)dstName.fUnion._48_8_;
          finalDstRule._4_4_ = finalDstRule._4_4_ + 1;
          atzrule._3_1_ = '\x01';
        }
        if (atzrule._3_1_ == '\0') {
          if (finalDstRule._4_4_ == 1) {
            writeZonePropsByTime
                      (this,w,'\x01',(UnicodeString *)&dstFromDSTSavings,dstToOffset,dstMonth,
                       dstUntilTime,'\x01',status);
          }
          else {
            writeZonePropsByDOW(this,w,'\x01',(UnicodeString *)&dstFromDSTSavings,dstToOffset,
                                dstMonth,dstWeekInMonth,dstStartTime._4_4_,dstMillisInDay,
                                dstUntilTime,UStack_b8,status);
          }
          UVar1 = ::U_FAILURE(*status);
          if (UVar1 != '\0') goto LAB_00254ecb;
        }
      }
      if (atzrule._3_1_ == '\0') {
        UnicodeString::operator=((UnicodeString *)&dstFromDSTSavings,(UnicodeString *)&fromOffset);
        dstToOffset = toOffset;
        dstStartYear = weekInMonth;
        dstMonth = iStack_1f0;
        dstDayOfWeek = dom;
        dstWeekInMonth = dow;
        dstMillisInDay = mid;
        dstStartTime._4_4_ = atzrule._4_4_;
        dstStartTime._0_4_ = local_170;
        UStack_b8 = (UDate)dstName.fUnion._48_8_;
        dstUntilTime = (UDate)dstName.fUnion._48_8_;
        finalDstRule._4_4_ = 1;
      }
      if ((_month != (AnnualTimeZoneRule *)0x0) && (stdName.fUnion._48_8_ != 0)) goto LAB_002546b5;
    }
    if (_month == (AnnualTimeZoneRule *)0x0) {
      pTVar9 = TimeZoneTransition::getTo((TimeZoneTransition *)local_198);
      if (pTVar9 == (TimeZoneRule *)0x0) {
        local_348 = (AnnualTimeZoneRule *)0x0;
      }
      else {
        local_348 = (AnnualTimeZoneRule *)
                    __dynamic_cast(pTVar9,&TimeZoneRule::typeinfo,&AnnualTimeZoneRule::typeinfo,0);
      }
      _dst = local_348;
      if ((local_348 != (AnnualTimeZoneRule *)0x0) &&
         (iVar6 = AnnualTimeZoneRule::getEndYear(local_348), iVar6 == 0x7fffffff)) {
        pTVar9 = TimeZoneTransition::getTo((TimeZoneTransition *)local_198);
        iVar5 = (*(pTVar9->super_UObject)._vptr_UObject[3])();
        _month = (AnnualTimeZoneRule *)CONCAT44(extraout_var_00,iVar5);
      }
    }
    if (0 < finalStdRule._4_4_) {
      if (((((dom == stdDayOfWeek + finalStdRule._4_4_) &&
            (iVar2 = UnicodeString::compare((UnicodeString *)&fromOffset,(UnicodeString *)local_108)
            , iVar2 == '\0')) && (stdToOffset == toOffset)) &&
          ((stdMonth == iStack_1f0 && (stdWeekInMonth == dow)))) &&
         ((stdMillisInDay == mid &&
          ((local_130 == atzrule._4_4_ && (stdStartTime._4_4_ == local_170)))))) {
        UStack_148 = (UDate)dstName.fUnion._48_8_;
        finalStdRule._4_4_ = finalStdRule._4_4_ + 1;
        atzrule._3_1_ = '\x01';
      }
      if (atzrule._3_1_ == '\0') {
        if (finalStdRule._4_4_ == 1) {
          writeZonePropsByTime
                    (this,w,'\0',(UnicodeString *)local_108,stdToOffset,stdMonth,stdUntilTime,'\x01'
                     ,status);
        }
        else {
          writeZonePropsByDOW(this,w,'\0',(UnicodeString *)local_108,stdToOffset,stdMonth,
                              stdWeekInMonth,local_130,stdMillisInDay,stdUntilTime,UStack_148,status
                             );
        }
        UVar1 = ::U_FAILURE(*status);
        if (UVar1 != '\0') goto LAB_00254ecb;
      }
    }
    if (atzrule._3_1_ == '\0') {
      UnicodeString::operator=((UnicodeString *)local_108,(UnicodeString *)&fromOffset);
      stdToOffset = toOffset;
      stdStartYear = weekInMonth;
      stdMonth = iStack_1f0;
      stdDayOfWeek = dom;
      stdWeekInMonth = dow;
      stdMillisInDay = mid;
      local_130 = atzrule._4_4_;
      stdStartTime._4_4_ = local_170;
      UStack_148 = (UDate)dstName.fUnion._48_8_;
      stdUntilTime = (UDate)dstName.fUnion._48_8_;
      finalStdRule._4_4_ = 1;
    }
  } while ((_month == (AnnualTimeZoneRule *)0x0) || (stdName.fUnion._48_8_ == 0));
LAB_002546b5:
  if (tzt.fTo._7_1_ == '\0') {
    (*(basictz->super_TimeZone).super_UObject._vptr_UObject[6])
              (0,basictz,0,&offset,&local_208,status);
    UVar1 = ::U_FAILURE(*status);
    if (UVar1 != '\0') goto LAB_00254ecb;
    tzid.fUnion._52_4_ = offset + local_208;
    fromDSTSavings._3_1_ = local_208 != 0;
    UnicodeString::UnicodeString((UnicodeString *)local_250);
    TimeZone::getID(&basictz->super_TimeZone,(UnicodeString *)local_250);
    getDefaultTZName((UnicodeString *)local_250,fromDSTSavings._3_1_,(UnicodeString *)&fromOffset);
    writeZonePropsByTime
              (this,w,fromDSTSavings._3_1_,(UnicodeString *)&fromOffset,tzid.fUnion._52_4_,
               tzid.fUnion._52_4_,0.0 - (double)(int)tzid.fUnion._52_4_,'\0',status);
    UVar1 = ::U_FAILURE(*status);
    if (UVar1 == '\0') {
      nextStart._4_4_ = 0;
    }
    else {
      nextStart._4_4_ = 7;
    }
    UnicodeString::~UnicodeString((UnicodeString *)local_250);
    if (nextStart._4_4_ != 0) goto LAB_00254ecb;
  }
  else {
    if (0 < finalDstRule._4_4_) {
      if (stdName.fUnion._48_8_ == 0) {
        if (finalDstRule._4_4_ == 1) {
          writeZonePropsByTime
                    (this,w,'\x01',(UnicodeString *)&dstFromDSTSavings,dstToOffset,dstMonth,
                     dstUntilTime,'\x01',status);
        }
        else {
          writeZonePropsByDOW(this,w,'\x01',(UnicodeString *)&dstFromDSTSavings,dstToOffset,dstMonth
                              ,dstWeekInMonth,dstStartTime._4_4_,dstMillisInDay,dstUntilTime,
                              UStack_b8,status);
        }
        cVar3 = ::U_FAILURE(*status);
      }
      else {
        if (finalDstRule._4_4_ == 1) {
          writeFinalRule(this,w,'\x01',(AnnualTimeZoneRule *)stdName.fUnion._48_8_,
                         dstToOffset - dstStartYear,dstStartYear,dstUntilTime,status);
        }
        else {
          pDVar10 = AnnualTimeZoneRule::getRule((AnnualTimeZoneRule *)stdName.fUnion._48_8_);
          UVar1 = isEquivalentDateRule(dstWeekInMonth,dstStartTime._4_4_,dstMillisInDay,pDVar10);
          if (UVar1 == '\0') {
            writeZonePropsByDOW(this,w,'\x01',(UnicodeString *)&dstFromDSTSavings,dstToOffset,
                                dstMonth,dstWeekInMonth,dstStartTime._4_4_,dstMillisInDay,
                                dstUntilTime,UStack_b8,status);
            UVar1 = ::U_FAILURE(*status);
            if (UVar1 != '\0') goto LAB_00254ecb;
            nextStart_1._7_1_ =
                 (**(code **)(*(long *)stdName.fUnion._48_8_ + 0x48))
                           (UStack_b8,stdName.fUnion._48_8_,dstToOffset - dstStartYear,dstStartYear,
                            0,&stack0xfffffffffffffda0);
            if (nextStart_1._7_1_ != '\0') {
              writeFinalRule(this,w,'\x01',(AnnualTimeZoneRule *)stdName.fUnion._48_8_,
                             dstToOffset - dstStartYear,dstStartYear,UStack_260,status);
            }
          }
          else {
            writeZonePropsByDOW(this,w,'\x01',(UnicodeString *)&dstFromDSTSavings,dstToOffset,
                                dstMonth,dstWeekInMonth,dstStartTime._4_4_,dstMillisInDay,
                                dstUntilTime,1.838821689216e+17,status);
          }
        }
        cVar3 = ::U_FAILURE(*status);
      }
      if (cVar3 != '\0') goto LAB_00254ecb;
    }
    month_00 = stdWeekInMonth;
    iVar7 = stdMillisInDay;
    iVar6 = local_130;
    if (0 < finalStdRule._4_4_) {
      if (_month == (AnnualTimeZoneRule *)0x0) {
        if (finalStdRule._4_4_ == 1) {
          writeZonePropsByTime
                    (this,w,'\0',(UnicodeString *)local_108,stdToOffset,stdMonth,stdUntilTime,'\x01'
                     ,status);
        }
        else {
          writeZonePropsByDOW(this,w,'\0',(UnicodeString *)local_108,stdToOffset,stdMonth,
                              stdWeekInMonth,local_130,stdMillisInDay,stdUntilTime,UStack_148,status
                             );
        }
        cVar3 = ::U_FAILURE(*status);
      }
      else {
        if (finalStdRule._4_4_ == 1) {
          writeFinalRule(this,w,'\0',_month,stdToOffset - stdStartYear,stdStartYear,stdUntilTime,
                         status);
        }
        else {
          pDVar10 = AnnualTimeZoneRule::getRule(_month);
          UVar1 = isEquivalentDateRule(month_00,iVar6,iVar7,pDVar10);
          if (UVar1 == '\0') {
            writeZonePropsByDOW(this,w,'\0',(UnicodeString *)local_108,stdToOffset,stdMonth,
                                stdWeekInMonth,local_130,stdMillisInDay,stdUntilTime,UStack_148,
                                status);
            UVar1 = ::U_FAILURE(*status);
            if (UVar1 != '\0') goto LAB_00254ecb;
            iVar5 = (*(_month->super_TimeZoneRule).super_UObject._vptr_UObject[9])
                              (UStack_148,_month,(ulong)(uint)(stdToOffset - stdStartYear),
                               (ulong)(uint)stdStartYear,0,&stack0xfffffffffffffd90);
            if ((char)iVar5 != '\0') {
              writeFinalRule(this,w,'\0',_month,stdToOffset - stdStartYear,stdStartYear,UStack_270,
                             status);
            }
          }
          else {
            writeZonePropsByDOW(this,w,'\0',(UnicodeString *)local_108,stdToOffset,stdMonth,
                                stdWeekInMonth,local_130,stdMillisInDay,stdUntilTime,
                                1.838821689216e+17,status);
          }
        }
        cVar3 = ::U_FAILURE(*status);
      }
      if (cVar3 != '\0') goto LAB_00254ecb;
    }
  }
  writeFooter(this,w,status);
LAB_00254ecb:
  if ((_month != (AnnualTimeZoneRule *)0x0) && (_month != (AnnualTimeZoneRule *)0x0)) {
    (*(_month->super_TimeZoneRule).super_UObject._vptr_UObject[1])();
  }
  if ((stdName.fUnion._48_8_ != 0) && (stdName.fUnion._48_8_ != 0)) {
    (**(code **)(*(long *)stdName.fUnion._48_8_ + 8))();
  }
  UnicodeString::~UnicodeString((UnicodeString *)&fromOffset);
  TimeZoneTransition::~TimeZoneTransition((TimeZoneTransition *)local_198);
  UnicodeString::~UnicodeString((UnicodeString *)local_108);
  UnicodeString::~UnicodeString((UnicodeString *)&dstFromDSTSavings);
  return;
}

Assistant:

void
VTimeZone::writeZone(VTZWriter& w, BasicTimeZone& basictz,
                     UVector* customProps, UErrorCode& status) const {
    if (U_FAILURE(status)) {
        return;
    }
    writeHeaders(w, status);
    if (U_FAILURE(status)) {
        return;
    }

    if (customProps != NULL) {
        for (int32_t i = 0; i < customProps->size(); i++) {
            UnicodeString *custprop = (UnicodeString*)customProps->elementAt(i);
            w.write(*custprop);
            w.write(ICAL_NEWLINE);
        }
    }

    UDate t = MIN_MILLIS;
    UnicodeString dstName;
    int32_t dstFromOffset = 0;
    int32_t dstFromDSTSavings = 0;
    int32_t dstToOffset = 0;
    int32_t dstStartYear = 0;
    int32_t dstMonth = 0;
    int32_t dstDayOfWeek = 0;
    int32_t dstWeekInMonth = 0;
    int32_t dstMillisInDay = 0;
    UDate dstStartTime = 0.0;
    UDate dstUntilTime = 0.0;
    int32_t dstCount = 0;
    AnnualTimeZoneRule *finalDstRule = NULL;

    UnicodeString stdName;
    int32_t stdFromOffset = 0;
    int32_t stdFromDSTSavings = 0;
    int32_t stdToOffset = 0;
    int32_t stdStartYear = 0;
    int32_t stdMonth = 0;
    int32_t stdDayOfWeek = 0;
    int32_t stdWeekInMonth = 0;
    int32_t stdMillisInDay = 0;
    UDate stdStartTime = 0.0;
    UDate stdUntilTime = 0.0;
    int32_t stdCount = 0;
    AnnualTimeZoneRule *finalStdRule = NULL;

    int32_t year, month, dom, dow, doy, mid;
    UBool hasTransitions = FALSE;
    TimeZoneTransition tzt;
    UBool tztAvail;
    UnicodeString name;
    UBool isDst;

    // Going through all transitions
    while (TRUE) {
        tztAvail = basictz.getNextTransition(t, FALSE, tzt);
        if (!tztAvail) {
            break;
        }
        hasTransitions = TRUE;
        t = tzt.getTime();
        tzt.getTo()->getName(name);
        isDst = (tzt.getTo()->getDSTSavings() != 0);
        int32_t fromOffset = tzt.getFrom()->getRawOffset() + tzt.getFrom()->getDSTSavings();
        int32_t fromDSTSavings = tzt.getFrom()->getDSTSavings();
        int32_t toOffset = tzt.getTo()->getRawOffset() + tzt.getTo()->getDSTSavings();
        Grego::timeToFields(tzt.getTime() + fromOffset, year, month, dom, dow, doy, mid);
        int32_t weekInMonth = Grego::dayOfWeekInMonth(year, month, dom);
        UBool sameRule = FALSE;
        const AnnualTimeZoneRule *atzrule;
        if (isDst) {
            if (finalDstRule == NULL
                && (atzrule = dynamic_cast<const AnnualTimeZoneRule *>(tzt.getTo())) != NULL
                && atzrule->getEndYear() == AnnualTimeZoneRule::MAX_YEAR
            ) {
                finalDstRule = (AnnualTimeZoneRule*)tzt.getTo()->clone();
            }
            if (dstCount > 0) {
                if (year == dstStartYear + dstCount
                        && name.compare(dstName) == 0
                        && dstFromOffset == fromOffset
                        && dstToOffset == toOffset
                        && dstMonth == month
                        && dstDayOfWeek == dow
                        && dstWeekInMonth == weekInMonth
                        && dstMillisInDay == mid) {
                    // Update until time
                    dstUntilTime = t;
                    dstCount++;
                    sameRule = TRUE;
                }
                if (!sameRule) {
                    if (dstCount == 1) {
                        writeZonePropsByTime(w, TRUE, dstName, dstFromOffset, dstToOffset, dstStartTime,
                                TRUE, status);
                    } else {
                        writeZonePropsByDOW(w, TRUE, dstName, dstFromOffset, dstToOffset,
                                dstMonth, dstWeekInMonth, dstDayOfWeek, dstStartTime, dstUntilTime, status);
                    }
                    if (U_FAILURE(status)) {
                        goto cleanupWriteZone;
                    }
                }
            } 
            if (!sameRule) {
                // Reset this DST information
                dstName = name;
                dstFromOffset = fromOffset;
                dstFromDSTSavings = fromDSTSavings;
                dstToOffset = toOffset;
                dstStartYear = year;
                dstMonth = month;
                dstDayOfWeek = dow;
                dstWeekInMonth = weekInMonth;
                dstMillisInDay = mid;
                dstStartTime = dstUntilTime = t;
                dstCount = 1;
            }
            if (finalStdRule != NULL && finalDstRule != NULL) {
                break;
            }
        } else {
            if (finalStdRule == NULL
                && (atzrule = dynamic_cast<const AnnualTimeZoneRule *>(tzt.getTo())) != NULL
                && atzrule->getEndYear() == AnnualTimeZoneRule::MAX_YEAR
            ) {
                finalStdRule = (AnnualTimeZoneRule*)tzt.getTo()->clone();
            }
            if (stdCount > 0) {
                if (year == stdStartYear + stdCount
                        && name.compare(stdName) == 0
                        && stdFromOffset == fromOffset
                        && stdToOffset == toOffset
                        && stdMonth == month
                        && stdDayOfWeek == dow
                        && stdWeekInMonth == weekInMonth
                        && stdMillisInDay == mid) {
                    // Update until time
                    stdUntilTime = t;
                    stdCount++;
                    sameRule = TRUE;
                }
                if (!sameRule) {
                    if (stdCount == 1) {
                        writeZonePropsByTime(w, FALSE, stdName, stdFromOffset, stdToOffset, stdStartTime,
                                TRUE, status);
                    } else {
                        writeZonePropsByDOW(w, FALSE, stdName, stdFromOffset, stdToOffset,
                                stdMonth, stdWeekInMonth, stdDayOfWeek, stdStartTime, stdUntilTime, status);
                    }
                    if (U_FAILURE(status)) {
                        goto cleanupWriteZone;
                    }
                }
            }
            if (!sameRule) {
                // Reset this STD information
                stdName = name;
                stdFromOffset = fromOffset;
                stdFromDSTSavings = fromDSTSavings;
                stdToOffset = toOffset;
                stdStartYear = year;
                stdMonth = month;
                stdDayOfWeek = dow;
                stdWeekInMonth = weekInMonth;
                stdMillisInDay = mid;
                stdStartTime = stdUntilTime = t;
                stdCount = 1;
            }
            if (finalStdRule != NULL && finalDstRule != NULL) {
                break;
            }
        }
    }
    if (!hasTransitions) {
        // No transition - put a single non transition RDATE
        int32_t raw, dst, offset;
        basictz.getOffset(0.0/*any time*/, FALSE, raw, dst, status);
        if (U_FAILURE(status)) {
            goto cleanupWriteZone;
        }
        offset = raw + dst;
        isDst = (dst != 0);
        UnicodeString tzid;
        basictz.getID(tzid);
        getDefaultTZName(tzid, isDst, name);        
        writeZonePropsByTime(w, isDst, name,
                offset, offset, DEF_TZSTARTTIME - offset, FALSE, status);    
        if (U_FAILURE(status)) {
            goto cleanupWriteZone;
        }
    } else {
        if (dstCount > 0) {
            if (finalDstRule == NULL) {
                if (dstCount == 1) {
                    writeZonePropsByTime(w, TRUE, dstName, dstFromOffset, dstToOffset, dstStartTime,
                            TRUE, status);
                } else {
                    writeZonePropsByDOW(w, TRUE, dstName, dstFromOffset, dstToOffset,
                            dstMonth, dstWeekInMonth, dstDayOfWeek, dstStartTime, dstUntilTime, status);
                }
                if (U_FAILURE(status)) {
                    goto cleanupWriteZone;
                }
            } else {
                if (dstCount == 1) {
                    writeFinalRule(w, TRUE, finalDstRule,
                            dstFromOffset - dstFromDSTSavings, dstFromDSTSavings, dstStartTime, status);
                } else {
                    // Use a single rule if possible
                    if (isEquivalentDateRule(dstMonth, dstWeekInMonth, dstDayOfWeek, finalDstRule->getRule())) {
                        writeZonePropsByDOW(w, TRUE, dstName, dstFromOffset, dstToOffset,
                                dstMonth, dstWeekInMonth, dstDayOfWeek, dstStartTime, MAX_MILLIS, status);
                    } else {
                        // Not equivalent rule - write out two different rules
                        writeZonePropsByDOW(w, TRUE, dstName, dstFromOffset, dstToOffset,
                                dstMonth, dstWeekInMonth, dstDayOfWeek, dstStartTime, dstUntilTime, status);
                        if (U_FAILURE(status)) {
                            goto cleanupWriteZone;
                        }
                        UDate nextStart;
                        UBool nextStartAvail = finalDstRule->getNextStart(dstUntilTime, dstFromOffset - dstFromDSTSavings, dstFromDSTSavings, false, nextStart);
                        U_ASSERT(nextStartAvail);
                        if (nextStartAvail) {
                            writeFinalRule(w, TRUE, finalDstRule,
                                    dstFromOffset - dstFromDSTSavings, dstFromDSTSavings, nextStart, status);
                        }
                    }
                }
                if (U_FAILURE(status)) {
                    goto cleanupWriteZone;
                }
            }
        }
        if (stdCount > 0) {
            if (finalStdRule == NULL) {
                if (stdCount == 1) {
                    writeZonePropsByTime(w, FALSE, stdName, stdFromOffset, stdToOffset, stdStartTime,
                            TRUE, status);
                } else {
                    writeZonePropsByDOW(w, FALSE, stdName, stdFromOffset, stdToOffset,
                            stdMonth, stdWeekInMonth, stdDayOfWeek, stdStartTime, stdUntilTime, status);
                }
                if (U_FAILURE(status)) {
                    goto cleanupWriteZone;
                }
            } else {
                if (stdCount == 1) {
                    writeFinalRule(w, FALSE, finalStdRule,
                            stdFromOffset - stdFromDSTSavings, stdFromDSTSavings, stdStartTime, status);
                } else {
                    // Use a single rule if possible
                    if (isEquivalentDateRule(stdMonth, stdWeekInMonth, stdDayOfWeek, finalStdRule->getRule())) {
                        writeZonePropsByDOW(w, FALSE, stdName, stdFromOffset, stdToOffset,
                                stdMonth, stdWeekInMonth, stdDayOfWeek, stdStartTime, MAX_MILLIS, status);
                    } else {
                        // Not equivalent rule - write out two different rules
                        writeZonePropsByDOW(w, FALSE, stdName, stdFromOffset, stdToOffset,
                                stdMonth, stdWeekInMonth, stdDayOfWeek, stdStartTime, stdUntilTime, status);
                        if (U_FAILURE(status)) {
                            goto cleanupWriteZone;
                        }
                        UDate nextStart;
                        UBool nextStartAvail = finalStdRule->getNextStart(stdUntilTime, stdFromOffset - stdFromDSTSavings, stdFromDSTSavings, false, nextStart);
                        U_ASSERT(nextStartAvail);
                        if (nextStartAvail) {
                            writeFinalRule(w, FALSE, finalStdRule,
                                    stdFromOffset - stdFromDSTSavings, stdFromDSTSavings, nextStart, status);
                        }
                    }
                }
                if (U_FAILURE(status)) {
                    goto cleanupWriteZone;
                }
            }
        }            
    }
    writeFooter(w, status);

cleanupWriteZone:

    if (finalStdRule != NULL) {
        delete finalStdRule;
    }
    if (finalDstRule != NULL) {
        delete finalDstRule;
    }
}